

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory * udata_findCachedData(char *path,UErrorCode *err)

{
  UBool UVar1;
  UHashtable *hash;
  char *key;
  void *pvVar2;
  char *baseName;
  DataCacheElement *el;
  UDataMemory *retVal;
  UHashtable *htable;
  UErrorCode *err_local;
  char *path_local;
  
  el = (DataCacheElement *)0x0;
  hash = udata_getHashTable(err);
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    key = findBasename(path);
    umtx_lock_63((UMutex *)0x0);
    pvVar2 = uhash_get_63(hash,key);
    umtx_unlock_63((UMutex *)0x0);
    if (pvVar2 != (void *)0x0) {
      el = *(DataCacheElement **)((long)pvVar2 + 8);
    }
    path_local = (char *)el;
  }
  else {
    path_local = (char *)0x0;
  }
  return (UDataMemory *)path_local;
}

Assistant:

static UDataMemory *udata_findCachedData(const char *path, UErrorCode &err)
{
    UHashtable        *htable;
    UDataMemory       *retVal = NULL;
    DataCacheElement  *el;
    const char        *baseName;

    htable = udata_getHashTable(err);
    if (U_FAILURE(err)) {
        return NULL;
    }

    baseName = findBasename(path);   /* Cache remembers only the base name, not the full path. */
    umtx_lock(NULL);
    el = (DataCacheElement *)uhash_get(htable, baseName);
    umtx_unlock(NULL);
    if (el != NULL) {
        retVal = el->item;
    }
#ifdef UDATA_DEBUG
    fprintf(stderr, "Cache: [%s] -> %p\n", baseName, retVal);
#endif
    return retVal;
}